

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O2

void __thiscall Painter::~Painter(Painter *this)

{
  ostream *poVar1;
  
  this->m_stopThread = true;
  if ((this->m_draw_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Deconstruct ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/roamiri[P]selfOrganizedNetwork/painter.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::thread::~thread(&this->m_draw_thread);
  std::vector<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>::~vector
            (&this->m_objects);
  return;
}

Assistant:

Painter::~Painter()
{
	m_stopThread = true;
	if(m_draw_thread.joinable())
		m_draw_thread.join();
	std::cout << "Deconstruct " << __FILE__ << std::endl;
}